

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timsort.h
# Opt level: O0

void libxml_domnode_tim_sort(xmlNodePtr *dst,size_t size)

{
  int iVar1;
  size_t local_848;
  size_t curr;
  size_t stack_curr;
  TIM_SORT_RUN_T run_stack [128];
  TEMP_STORAGE_T *store;
  TEMP_STORAGE_T _store;
  size_t minrun;
  size_t size_local;
  xmlNodePtr *dst_local;
  
  curr = 0;
  local_848 = 0;
  if (1 < size) {
    if (size < 0x40) {
      libxml_domnode_binary_insertion_sort(dst,size);
    }
    else {
      iVar1 = compute_minrun(size);
      _store.storage = (xmlNodePtr *)(long)iVar1;
      run_stack[0x7f].length = (size_t)&store;
      store = (TEMP_STORAGE_T *)0x0;
      _store.alloc = 0;
      iVar1 = PUSH_NEXT(dst,size,(TEMP_STORAGE_T *)run_stack[0x7f].length,(size_t)_store.storage,
                        (TIM_SORT_RUN_T *)&stack_curr,&curr,&local_848);
      if ((iVar1 != 0) &&
         (iVar1 = PUSH_NEXT(dst,size,(TEMP_STORAGE_T *)run_stack[0x7f].length,(size_t)_store.storage
                            ,(TIM_SORT_RUN_T *)&stack_curr,&curr,&local_848), iVar1 != 0)) {
        iVar1 = PUSH_NEXT(dst,size,(TEMP_STORAGE_T *)run_stack[0x7f].length,(size_t)_store.storage,
                          (TIM_SORT_RUN_T *)&stack_curr,&curr,&local_848);
        while (iVar1 != 0) {
          while (iVar1 = libxml_domnode_check_invariant((TIM_SORT_RUN_T *)&stack_curr,(int)curr),
                iVar1 == 0) {
            iVar1 = libxml_domnode_tim_sort_collapse
                              (dst,(TIM_SORT_RUN_T *)&stack_curr,(int)curr,
                               (TEMP_STORAGE_T *)run_stack[0x7f].length,size);
            curr = (size_t)iVar1;
          }
          iVar1 = PUSH_NEXT(dst,size,(TEMP_STORAGE_T *)run_stack[0x7f].length,(size_t)_store.storage
                            ,(TIM_SORT_RUN_T *)&stack_curr,&curr,&local_848);
        }
      }
    }
  }
  return;
}

Assistant:

void TIM_SORT(SORT_TYPE *dst, const size_t size) {
  size_t minrun;
  TEMP_STORAGE_T _store, *store;
  TIM_SORT_RUN_T run_stack[TIM_SORT_STACK_SIZE];
  size_t stack_curr = 0;
  size_t curr = 0;

  /* don't bother sorting an array of size 1 */
  if (size <= 1) {
    return;
  }

  if (size < 64) {
    BINARY_INSERTION_SORT(dst, size);
    return;
  }

  /* compute the minimum run length */
  minrun = compute_minrun(size);
  /* temporary storage for merges */
  store = &_store;
  store->alloc = 0;
  store->storage = NULL;

  if (!PUSH_NEXT(dst, size, store, minrun, run_stack, &stack_curr, &curr)) {
    return;
  }

  if (!PUSH_NEXT(dst, size, store, minrun, run_stack, &stack_curr, &curr)) {
    return;
  }

  if (!PUSH_NEXT(dst, size, store, minrun, run_stack, &stack_curr, &curr)) {
    return;
  }

  while (1) {
    if (!CHECK_INVARIANT(run_stack, stack_curr)) {
      stack_curr = TIM_SORT_COLLAPSE(dst, run_stack, stack_curr, store, size);
      continue;
    }

    if (!PUSH_NEXT(dst, size, store, minrun, run_stack, &stack_curr, &curr)) {
      return;
    }
  }
}